

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::CPrimitiveMode::Setup(CPrimitiveMode *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar3;
  uint uVar4;
  
  iVar1 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  this->_sizeX = *(uint *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar2 = *(uint *)(CONCAT44(extraout_var_00,iVar1) + 4);
  this->_sizeY = uVar2;
  uVar3 = this->_primitiveType;
  if ((0xd < uVar3) || ((0x3070U >> (uVar3 & 0x1f) & 1) == 0)) {
    *(byte *)&this->_sizeX = (byte)this->_sizeX & 0xfc;
    uVar2 = uVar2 & 0xfffffffc;
    this->_sizeY = uVar2;
  }
  if (((int)this->_drawSizeX < 0) || ((int)this->_drawSizeY < 0)) {
    uVar4 = this->_sizeX;
    this->_drawSizeX = uVar4;
    this->_drawSizeY = uVar2;
    if (uVar3 == 0) {
      if (99 < uVar4) {
        uVar4 = 100;
      }
      this->_drawSizeX = uVar4;
      this->_sizeX = uVar4;
      uVar3 = 100;
      if (uVar2 < 100) {
        uVar3 = uVar2;
      }
      this->_drawSizeY = uVar3;
      this->_sizeY = uVar3;
    }
  }
  glu::CallLogWrapper::glClear
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x4000);
  return 0;
}

Assistant:

virtual long Setup()
	{
		_sizeX = getWindowWidth();
		_sizeY = getWindowHeight();
		if (_primitiveType != GL_TRIANGLE_STRIP && _primitiveType != GL_TRIANGLE_STRIP_ADJACENCY &&
			_primitiveType != GL_TRIANGLES && _primitiveType != GL_TRIANGLES_ADJACENCY &&
			_primitiveType != GL_TRIANGLE_FAN)
		{
			_sizeX &= (-4);
			_sizeY &= (-4);
		}
		if ((int)_drawSizeX < 0 || (int)_drawSizeY < 0)
		{
			//no PrimitiveGen dimensions given. assume same dimensions as rendered image^
			_drawSizeX = _sizeX;
			_drawSizeY = _sizeY;
			if (_primitiveType == GL_POINTS)
			{
				//clamp vertex number (and rendering size) for points to max. 10000
				_sizeX = _drawSizeX = std::min(_drawSizeX, 100u);
				_sizeY = _drawSizeY = std::min(_drawSizeY, 100u);
			}
		}

		glClear(GL_COLOR_BUFFER_BIT);
		return NO_ERROR;
	}